

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

pair<const_spvtools::val::BasicBlock_*,_bool> __thiscall
spvtools::val::Function::GetBlock(Function *this,uint32_t block_id)

{
  bool bVar1;
  pointer pvVar2;
  undefined8 extraout_RDX;
  pair<const_spvtools::val::BasicBlock_*,_bool> pVar3;
  pair<const_spvtools::val::BasicBlock_*,_bool> pVar4;
  bool local_88 [8];
  pair<std::nullptr_t,_bool> local_80 [2];
  _Node_iterator_base<unsigned_int,_false> local_60;
  uint32_t local_54;
  _Node_iterator_base<unsigned_int,_false> local_50;
  bool local_41;
  BasicBlock *pBStack_40;
  bool defined;
  BasicBlock *block;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false> local_30;
  const_iterator b;
  uint32_t block_id_local;
  Function *this_local;
  bool local_10;
  
  b.super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>.
  _M_cur._4_4_ = block_id;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::val::BasicBlock,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>_>
       ::find(&this->blocks_,
              (key_type *)
              ((long)&b.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                      ._M_cur + 4));
  block = (BasicBlock *)
          std::
          end<std::unordered_map<unsigned_int,spvtools::val::BasicBlock,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>>>
                    (&this->blocks_);
  bVar1 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                      *)&block);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>
                           *)&local_30);
    pBStack_40 = &pvVar2->second;
    local_54 = BasicBlock::id(pBStack_40);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::find(&this->undefined_blocks_,&local_54);
    local_60._M_cur =
         (__node_type *)
         std::
         end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                   (&this->undefined_blocks_);
    local_41 = std::__detail::operator==(&local_50,&local_60);
    pVar3 = std::make_pair<spvtools::val::BasicBlock_const*&,bool&>
                      (&stack0xffffffffffffffc0,&local_41);
    local_10 = pVar3.second;
  }
  else {
    local_88[0] = false;
    local_88[1] = false;
    local_88[2] = false;
    local_88[3] = false;
    local_88[4] = false;
    local_88[5] = false;
    local_88[6] = false;
    local_88[7] = false;
    std::make_pair<decltype(nullptr),bool>(&local_80[0].first,local_88);
    std::pair<const_spvtools::val::BasicBlock_*,_bool>::pair<std::nullptr_t,_bool,_true>
              ((pair<const_spvtools::val::BasicBlock_*,_bool> *)&this_local,local_80);
    pVar3._8_8_ = extraout_RDX;
    pVar3.first = (BasicBlock *)this_local;
  }
  this_local = (Function *)pVar3.first;
  pVar4._9_7_ = pVar3._9_7_;
  pVar4.second = local_10;
  pVar4.first = (BasicBlock *)this_local;
  return pVar4;
}

Assistant:

std::pair<const BasicBlock*, bool> Function::GetBlock(uint32_t block_id) const {
  const auto b = blocks_.find(block_id);
  if (b != end(blocks_)) {
    const BasicBlock* block = &(b->second);
    bool defined =
        undefined_blocks_.find(block->id()) == std::end(undefined_blocks_);
    return std::make_pair(block, defined);
  } else {
    return std::make_pair(nullptr, false);
  }
}